

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O1

size_t EntityRelationTask::predict_entity
                 (search *sch,example *ex,v_array<unsigned_long> *param_3,ptag my_tag,bool isLdf)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  byte *pbVar4;
  long *plVar5;
  action aVar6;
  predictor *ppVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  long *plVar11;
  float loss;
  v_array<unsigned_int> star_labels;
  v_array<unsigned_int> local_138;
  predictor local_118;
  
  pvVar2 = sch->task_data;
  if (*(char *)((long)pvVar2 + 0x11) == '\x01') {
    local_138.end_array = (uint *)0x0;
    local_138.erase_count = 0;
    local_138._begin = (uint *)0x0;
    local_138._end = (uint *)0x0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&(ex->l).empty);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&local_118);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)((long)pvVar2 + 0x18),(uint *)&local_118);
    Search::predictor::predictor(&local_118,sch,my_tag);
    ppVar7 = Search::predictor::set_input(&local_118,ex);
    ppVar7 = Search::predictor::set_oracle(ppVar7,&local_138);
    ppVar7 = Search::predictor::set_allowed(ppVar7,(v_array<unsigned_int> *)((long)pvVar2 + 0x18));
    ppVar7 = Search::predictor::set_learner_id(ppVar7,1);
    aVar6 = Search::predictor::predict(ppVar7);
    Search::predictor::~predictor(&local_118);
    *(long *)((long)pvVar2 + 0x20) = *(long *)((long)pvVar2 + 0x20) + -4;
  }
  else {
    if (isLdf) {
      lVar8 = 0;
      do {
        lVar10 = lVar8 * 0x68d0;
        VW::copy_example_data(false,(example *)(*(long *)((long)pvVar2 + 0x60) + lVar10),ex);
        lVar3 = *(long *)((long)pvVar2 + 0x60);
        lVar1 = lVar8 + 1;
        pbVar9 = *(byte **)(lVar3 + lVar10);
        pbVar4 = *(byte **)(lVar3 + 8 + lVar10);
        if (pbVar9 != pbVar4) {
          do {
            plVar5 = *(long **)(lVar3 + lVar10 + 0x48 + (ulong)*pbVar9 * 0x68);
            for (plVar11 = *(long **)(lVar3 + lVar10 + 0x40 + (ulong)*pbVar9 * 0x68);
                plVar11 != plVar5; plVar11 = plVar11 + 1) {
              *plVar11 = *plVar11 * 0x1b90d09 + lVar1 * 0x49be95;
            }
            pbVar9 = pbVar9 + 1;
          } while (pbVar9 != pbVar4);
        }
        lVar3 = *(long *)((long)pvVar2 + 0x60);
        **(undefined4 **)(lVar3 + 0x6828 + lVar10) = 0;
        *(int *)(*(long *)(lVar3 + 0x6828 + lVar10) + 4) = (int)lVar8;
        *(undefined4 *)(*(long *)(lVar3 + 0x6828 + lVar10) + 8) = 0;
        *(undefined4 *)(*(long *)(lVar3 + 0x6828 + lVar10) + 0xc) = 0;
        lVar8 = lVar1;
      } while (lVar1 != 4);
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar7 = Search::predictor::set_input(&local_118,*(example **)((long)pvVar2 + 0x60),4);
      ppVar7 = Search::predictor::set_oracle(ppVar7,(ex->l).multi.label - 1);
      ppVar7 = Search::predictor::set_learner_id(ppVar7,1);
      aVar6 = Search::predictor::predict(ppVar7);
      aVar6 = aVar6 + 1;
    }
    else {
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar7 = Search::predictor::set_input(&local_118,ex);
      ppVar7 = Search::predictor::set_oracle(ppVar7,(ex->l).multi.label);
      ppVar7 = Search::predictor::set_allowed(ppVar7,(v_array<unsigned_int> *)((long)pvVar2 + 0x18))
      ;
      ppVar7 = Search::predictor::set_learner_id(ppVar7,0);
      aVar6 = Search::predictor::predict(ppVar7);
    }
    Search::predictor::~predictor(&local_118);
  }
  lVar8 = 0xc;
  if (aVar6 != 0xb) {
    lVar8 = 4;
    loss = 0.0;
    if (aVar6 == (ex->l).multi.label) goto LAB_0013add2;
  }
  loss = *(float *)((long)pvVar2 + lVar8);
LAB_0013add2:
  Search::search::loss(sch,loss);
  return (ulong)aVar6;
}

Assistant:

size_t predict_entity(
    Search::search& sch, example* ex, v_array<size_t>& /*predictions*/, ptag my_tag, bool isLdf = false)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    my_task_data->y_allowed_entity.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(my_task_data->y_allowed_entity)
                     .set_learner_id(1)
                     .predict();
    my_task_data->y_allowed_entity.pop();
  }
  else
  {
    if (isLdf)
    {
      for (uint32_t a = 0; a < 4; a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_entity[a], ex);
        update_example_indicies(true, &my_task_data->ldf_entity[a], 28904713, 4832917 * (uint64_t)(a + 1));
        CS::label& lab = my_task_data->ldf_entity[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = a;
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
      }
      prediction = Search::predictor(sch, my_tag)
                       .set_input(my_task_data->ldf_entity, 4)
                       .set_oracle(ex->l.multi.label - 1)
                       .set_learner_id(1)
                       .predict() +
          1;
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(my_task_data->y_allowed_entity)
                       .set_learner_id(0)
                       .predict();
    }
  }

  // record loss
  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
    loss = my_task_data->entity_cost;
  sch.loss(loss);
  return prediction;
}